

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O2

sexp type_exception(sexp ctx,sexp self,sexp str,sexp obj,sexp src)

{
  sexp psVar1;
  sexp_sint_t n;
  sexp sym;
  sexp res;
  sexp_gc_var_t local_50;
  sexp_gc_var_t local_40;
  
  local_40.var = &res;
  res = (sexp)&DAT_0000043e;
  local_50.var = &sym;
  sym = (sexp)&DAT_0000043e;
  local_50.next = &local_40;
  local_40.next = (ctx->value).context.saves;
  (ctx->value).context.saves = &local_50;
  psVar1 = sexp_intern(ctx,"type",-1);
  sym = psVar1;
  res = sexp_make_exception(ctx,psVar1,str,obj,self,(sexp)&DAT_0000003e);
  psVar1 = sexp_cons_op(ctx,psVar1,n,(res->value).type.slots,(sexp)&DAT_0000023e);
  (res->value).type.slots = psVar1;
  (ctx->value).context.saves = local_40.next;
  return res;
}

Assistant:

static sexp type_exception (sexp ctx, sexp self, sexp str, sexp obj, sexp src) {
  sexp_gc_var2(res, sym);
  sexp_gc_preserve2(ctx, res, sym);
  sym = sexp_intern(ctx, "type", -1);
  res = sexp_make_exception(ctx, sym, str, obj, self, src);
  sexp_exception_irritants(res)=sexp_list1(ctx, sexp_exception_irritants(res));
  sexp_gc_release2(ctx);
  return res;
}